

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O1

bool check_barred(CHAR_DATA *ch,ROOM_INDEX_DATA *to_room)

{
  short sVar1;
  CHAR_DATA *ch_00;
  BARRED_DATA *pBVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CClass *pCVar6;
  OBJ_DATA *pOVar7;
  byte unaff_BPL;
  
  ch_00 = ch->in_room->people;
  iVar4 = 0;
  do {
    if (ch_00 == (CHAR_DATA *)0x0) {
      unaff_BPL = 0;
LAB_002594aa:
      return (bool)(unaff_BPL & 1);
    }
    bVar3 = is_npc(ch_00);
    if (((bVar3) && (pBVar2 = ch_00->pIndexData->barred_entry, pBVar2 != (BARRED_DATA *)0x0)) &&
       (pBVar2->vnum == to_room->vnum)) {
      if (pBVar2->type == 0) {
        pCVar6 = ch->my_class;
        if ((pCVar6 == (CClass *)0x0) &&
           ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
            (pCVar6 = ch->pIndexData->my_class, pCVar6 == (CClass *)0x0)))) {
          pCVar6 = CClass::GetClass(0);
        }
        iVar4 = CClass::GetIndex(pCVar6);
      }
      sVar1 = ch_00->pIndexData->barred_entry->type;
      if (sVar1 == 1) {
        iVar4 = (int)ch->cabal;
      }
      if (sVar1 == 2) {
        iVar4 = (int)ch->size;
      }
      if (sVar1 == 4) {
        iVar4 = (int)ch->level;
      }
      if (sVar1 == 3) {
        pOVar7 = get_eq_char(ch,0x13);
        if ((pOVar7 == (OBJ_DATA *)0x0) && (ch_00->pIndexData->barred_entry->value != 0)) {
          unaff_BPL = bar_entry(ch,ch_00,to_room);
          bVar3 = false;
        }
        else {
          iVar4 = (int)pOVar7->pIndexData->vnum;
          bVar3 = true;
        }
        if (!bVar3) goto LAB_002594aa;
      }
      if (ch_00->pIndexData->barred_entry->type == 0) {
        pCVar6 = ch->my_class;
        if ((pCVar6 == (CClass *)0x0) &&
           ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
            (pCVar6 = ch->pIndexData->my_class, pCVar6 == (CClass *)0x0)))) {
          pCVar6 = CClass::GetClass(0);
        }
        iVar5 = CClass::GetIndex(pCVar6);
        if ((((iVar5 == ch_00->pIndexData->barred_entry->value) &&
             ((ch_00->act[0] & 0x2000000) != 0)) && (0 < ch->pause)) &&
           ((ch->ghost < 1 && (bVar3 = is_immortal(ch), !bVar3)))) {
          send_to_char("Your guild will not offer you sanctuary yet.\n\r",ch);
          unaff_BPL = 1;
          goto LAB_002594aa;
        }
      }
      pBVar2 = ch_00->pIndexData->barred_entry;
      sVar1 = pBVar2->comparison;
      if (sVar1 == 2) {
        if (iVar4 <= pBVar2->value) goto LAB_002594b9;
      }
      else if (sVar1 == 1) {
        if (pBVar2->value <= iVar4) goto LAB_002594b9;
      }
      else if ((sVar1 == 0) && (iVar4 != pBVar2->value)) {
LAB_002594b9:
        bVar3 = bar_entry(ch,ch_00,to_room);
        return bVar3;
      }
    }
    ch_00 = ch_00->next_in_room;
  } while( true );
}

Assistant:

bool check_barred(CHAR_DATA *ch, ROOM_INDEX_DATA *to_room)
{
	int field = 0;

	for (auto blocker = ch->in_room->people; blocker != nullptr; blocker = blocker->next_in_room)
	{
		if (is_npc(blocker)
			&& blocker->pIndexData->barred_entry
			&& blocker->pIndexData->barred_entry->vnum == to_room->vnum)
		{

			if (blocker->pIndexData->barred_entry->type == BAR_CLASS)
				field = ch->Class()->GetIndex();

			if (blocker->pIndexData->barred_entry->type == BAR_CABAL)
				field = ch->cabal;

			if (blocker->pIndexData->barred_entry->type == BAR_SIZE)
				field = ch->size;

			if (blocker->pIndexData->barred_entry->type == BAR_LEVEL)
				field = ch->level;

			if (blocker->pIndexData->barred_entry->type == BAR_TATTOO)
			{
				auto tattoo = get_eq_char(ch, WEAR_BRAND);

				if (!tattoo && blocker->pIndexData->barred_entry->value)
					return bar_entry(ch, blocker, to_room);

				field = tattoo->pIndexData->vnum;
			}

			if (blocker->pIndexData->barred_entry->type == BAR_CLASS
				&& ch->Class()->GetIndex() == blocker->pIndexData->barred_entry->value
				&& IS_SET(blocker->act, ACT_GUILDGUARD)
				&& ch->pause > 0
				&& ch->ghost <= 0
				&& !is_immortal(ch))
			{
				send_to_char("Your guild will not offer you sanctuary yet.\n\r", ch);
				return true;
			}

			if ((blocker->pIndexData->barred_entry->comparison == BAR_EQUAL_TO && field != blocker->pIndexData->barred_entry->value)
				|| (blocker->pIndexData->barred_entry->comparison == BAR_LESS_THAN && field >= blocker->pIndexData->barred_entry->value)
				|| (blocker->pIndexData->barred_entry->comparison == BAR_GREATER_THAN && field <= blocker->pIndexData->barred_entry->value))
			{
				return bar_entry(ch, blocker, to_room);
			}
		}
	}

	return false;
}